

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *piMinKey,i64 maxKey)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  BtShared *pBt;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  MemPage *pMVar9;
  u8 *puVar10;
  ushort uVar11;
  u16 uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  u8 uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ushort *puVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint N;
  uint *puVar26;
  MemPage *pPage;
  CellInfo info;
  int local_fc;
  i64 local_c0;
  MemPage *local_b8;
  MemPage *local_b0;
  BtShared *local_a8;
  u8 *local_a0;
  ulong local_98;
  uint local_90;
  uint local_8c;
  int local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  u8 *local_60;
  uint *local_58;
  CellInfo local_50;
  i64 *local_38;
  
  local_b0 = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar6 = pCheck->zPfx;
  iVar4 = pCheck->v1;
  iVar5 = pCheck->v2;
  uVar14 = pBt->usableSize;
  local_c0 = maxKey;
  local_38 = piMinKey;
  iVar13 = checkRef(pCheck,iPage);
  if (iVar13 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  local_98 = (ulong)uVar14;
  uVar14 = btreeGetPage(pBt,iPage,&local_b0,0);
  pMVar9 = local_b0;
  if (uVar14 == 0) {
    uVar18 = local_b0->isInit;
    local_b0->isInit = '\0';
    uVar14 = btreeInitPage(local_b0);
    if (uVar14 == 0) {
      local_a0 = pMVar9->aData;
      local_80 = (ulong)pMVar9->hdrOffset;
      pCheck->zPfx = "On tree page %d cell %d: ";
      bVar1 = local_a0[local_80 + 5];
      bVar2 = local_a0[local_80 + 6];
      local_70 = (ulong)local_a0[local_80 + 3] << 8;
      local_78 = (ulong)local_a0[local_80 + 4];
      local_68 = (ulong)((uint)local_a0[local_80 + 4] + (int)local_70);
      local_b8 = pMVar9;
      lVar25 = local_80 - (uint)pMVar9->leaf * 4;
      local_a8 = pBt;
      if (pMVar9->leaf == 0) {
        uVar14 = *(uint *)(local_a0 + local_80 + 8);
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        if (pBt->autoVacuum != '\0') {
          pCheck->zPfx = "On page %d at right child: ";
          checkPtrmap(pCheck,uVar14,'\x05',iPage);
        }
        local_fc = checkTreePage(pCheck,uVar14,&local_c0,maxKey);
        puVar26 = (uint *)0x0;
        bVar7 = false;
      }
      else {
        puVar26 = pCheck->heap;
        *puVar26 = 0;
        local_fc = -1;
        bVar7 = true;
      }
      local_60 = (u8 *)(lVar25 + 0xc);
      uVar14 = ((uint)bVar1 * 0x100 + (uint)bVar2) - 1 & 0xffff;
      if ((int)local_68 == 0) {
        bVar8 = false;
      }
      else {
        local_84 = uVar14 + 1;
        puVar22 = (ushort *)(local_a0 + ((int)lVar25 + 10 + (int)local_68 * 2));
        iVar13 = (int)local_70 + (int)local_78;
        uVar24 = (int)local_98 - 4;
        local_88 = (int)local_98 + -5;
        bVar8 = true;
        do {
          pMVar9 = local_b8;
          iVar13 = iVar13 + -1;
          if (pCheck->mxErr == 0) break;
          pCheck->v2 = iVar13;
          uVar11 = *puVar22 << 8 | *puVar22 >> 8;
          uVar20 = (uint)uVar11;
          if (uVar24 < uVar20 || uVar11 <= uVar14) {
            bVar8 = false;
            checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar11,(ulong)local_84,
                           (ulong)uVar24);
          }
          else {
            local_58 = (uint *)(local_a0 + uVar20);
            (*local_b8->xParseCell)(local_b8,(u8 *)local_58,&local_50);
            if ((uint)local_98 < local_50.nSize + uVar20) {
              bVar8 = false;
              checkAppendMsg(pCheck,"Extends off end of page");
            }
            else {
              if (pMVar9->intKey != '\0') {
                if (bVar7) {
                  if (local_c0 < local_50.nKey) {
LAB_001471a9:
                    checkAppendMsg(pCheck,"Rowid %lld out of order",local_50.nKey);
                  }
                }
                else if (local_c0 <= local_50.nKey) goto LAB_001471a9;
                local_c0 = local_50.nKey;
                bVar7 = false;
              }
              if (local_50.nLocal < local_50.nPayload) {
                N = ((local_50.nPayload + local_88) - (uint)local_50.nLocal) / uVar24;
                uVar19 = *(uint *)((long)local_58 + ((ulong)local_50.nSize - 4));
                uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18;
                if (local_a8->autoVacuum != '\0') {
                  local_90 = uVar19;
                  local_8c = N;
                  checkPtrmap(pCheck,uVar19,'\x03',iPage);
                  uVar19 = local_90;
                  N = local_8c;
                }
                checkList(pCheck,0,uVar19,N);
              }
              if (local_b8->leaf == '\0') {
                uVar20 = *local_58;
                uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18;
                if (local_a8->autoVacuum != '\0') {
                  checkPtrmap(pCheck,uVar20,'\x05',iPage);
                }
                iVar15 = checkTreePage(pCheck,uVar20,&local_c0,local_c0);
                if (iVar15 == local_fc) {
                  bVar7 = false;
                }
                else {
                  bVar7 = false;
                  checkAppendMsg(pCheck,"Child page depth differs");
                  local_fc = iVar15;
                }
              }
              else {
                uVar19 = *puVar26 + 1;
                *puVar26 = uVar19;
                puVar26[uVar19] = ((uint)uVar11 + (uint)local_50.nSize) - 1 | uVar20 << 0x10;
                uVar16 = (ulong)uVar19;
                if (1 < uVar19) {
                  do {
                    uVar17 = uVar16 >> 1;
                    uVar20 = puVar26[uVar17];
                    if (uVar20 <= puVar26[uVar16]) break;
                    puVar26[uVar17] = puVar26[uVar16];
                    puVar26[uVar16] = uVar20;
                    uVar20 = (uint)uVar16;
                    uVar16 = uVar17;
                  } while (3 < uVar20);
                }
              }
            }
          }
          puVar22 = puVar22 + -1;
        } while (0 < iVar13);
        bVar8 = !bVar8;
      }
      puVar10 = local_a0;
      *local_38 = local_c0;
      pCheck->zPfx = (char *)0x0;
      bVar7 = true;
      if (!bVar8) {
        if (0 < pCheck->mxErr) {
          if (local_b8->leaf == '\0') {
            puVar26 = pCheck->heap;
            *puVar26 = 0;
            if ((int)local_68 != 0) {
              local_60 = local_60 + (long)local_a0;
              uVar16 = (ulong)((uint)local_70 | (uint)local_78);
              do {
                uVar11 = *(ushort *)(local_60 + uVar16 * 2 + -2) << 8 |
                         *(ushort *)(local_60 + uVar16 * 2 + -2) >> 8;
                uVar12 = (*local_b8->xCellSize)(local_b8,puVar10 + uVar11);
                uVar24 = *puVar26 + 1;
                *puVar26 = uVar24;
                puVar26[uVar24] = ((uint)uVar11 + (uint)uVar12) - 1 | (uint)uVar11 << 0x10;
                uVar17 = (ulong)uVar24;
                if (1 < uVar24) {
                  do {
                    uVar23 = uVar17 >> 1;
                    uVar24 = puVar26[uVar23];
                    if (uVar24 <= puVar26[uVar17]) break;
                    puVar26[uVar23] = puVar26[uVar17];
                    puVar26[uVar17] = uVar24;
                    uVar24 = (uint)uVar17;
                    uVar17 = uVar23;
                  } while (3 < uVar24);
                }
                bVar7 = 1 < (long)uVar16;
                uVar16 = uVar16 - 1;
              } while (bVar7);
            }
          }
          for (uVar11 = *(ushort *)(puVar10 + local_80 + 1) << 8 |
                        *(ushort *)(puVar10 + local_80 + 1) >> 8; uVar11 != 0;
              uVar11 = *(ushort *)(puVar10 + uVar11) << 8 | *(ushort *)(puVar10 + uVar11) >> 8) {
            uVar3 = *(ushort *)(puVar10 + (ulong)uVar11 + 2);
            uVar24 = *puVar26 + 1;
            *puVar26 = uVar24;
            puVar26[uVar24] =
                 ((uint)(ushort)(uVar3 << 8 | uVar3 >> 8) + (uint)uVar11) - 1 | (uint)uVar11 << 0x10
            ;
            uVar16 = (ulong)uVar24;
            if (1 < uVar24) {
              do {
                uVar17 = uVar16 >> 1;
                uVar24 = puVar26[uVar17];
                if (uVar24 <= puVar26[uVar16]) break;
                puVar26[uVar17] = puVar26[uVar16];
                puVar26[uVar16] = uVar24;
                uVar24 = (uint)uVar16;
                uVar16 = uVar17;
              } while (3 < uVar24);
            }
          }
          uVar24 = 0;
          iVar13 = 0;
          do {
            uVar20 = *puVar26;
            uVar16 = (ulong)uVar20;
            if (uVar16 != 0) {
              uVar24 = puVar26[1];
              puVar26[1] = puVar26[uVar16];
              puVar26[uVar16] = 0xffffffff;
              *puVar26 = uVar20 - 1;
              if (2 < uVar20) {
                uVar23 = 2;
                uVar17 = 1;
                do {
                  uVar21 = (ulong)((uint)uVar23 | 1);
                  if (puVar26[uVar23] <= puVar26[uVar21]) {
                    uVar21 = uVar23;
                  }
                  uVar20 = puVar26[uVar17];
                  if (uVar20 < puVar26[uVar21]) break;
                  puVar26[uVar17] = puVar26[uVar21];
                  puVar26[uVar21] = uVar20;
                  uVar20 = (int)uVar21 * 2;
                  uVar23 = (ulong)uVar20;
                  uVar17 = uVar21;
                } while (uVar20 <= *puVar26);
              }
            }
            if (uVar16 == 0) goto LAB_00147589;
            uVar20 = uVar24 >> 0x10;
            if (uVar20 <= (uVar14 & 0xffff)) goto LAB_00147572;
            iVar13 = iVar13 + uVar20 + ~(uVar14 & 0xffff);
            uVar14 = uVar24;
          } while( true );
        }
        bVar7 = false;
      }
      goto LAB_00146eff;
    }
    checkAppendMsg(pCheck,"btreeInitPage() returns error code %d",(ulong)uVar14);
  }
  else {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar14);
    uVar18 = '\0';
  }
  bVar7 = false;
  local_fc = -1;
  goto LAB_00146eff;
LAB_00147572:
  checkAppendMsg(pCheck,"Multiple uses for byte %u of page %d",(ulong)uVar20,(ulong)(uint)iPage);
LAB_00147589:
  if (*puVar26 == 0) {
    uVar14 = (int)local_98 + (~uVar14 | 0xffff0000) + iVar13;
    if (uVar14 != puVar10[local_80 + 7]) {
      checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",(ulong)uVar14,
                     (ulong)puVar10[local_80 + 7],(ulong)(uint)iPage);
    }
  }
  bVar7 = false;
LAB_00146eff:
  if (bVar7) {
    local_b0->isInit = uVar18;
  }
  if (local_b0 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_b0->pDbPage);
  }
  pCheck->zPfx = pcVar6;
  pCheck->v1 = iVar4;
  pCheck->v2 = iVar5;
  return local_fc + 1;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %d cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %d at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      int nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. 
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize );  /* Enforced by btreeInitPage() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( (u32)j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or 
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    ** 
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.  
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %d", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}